

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketGroup<MediumAllocationBlockAttributes>::SweepPartialReusePages
          (HeapBucketGroup<MediumAllocationBlockAttributes> *this,RecyclerSweep *recyclerSweep)

{
  RecyclerSweep *recyclerSweep_local;
  HeapBucketGroup<MediumAllocationBlockAttributes> *this_local;
  
  SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
  SweepPartialReusePages
            ((SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
              *)this,recyclerSweep);
  SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  ::SweepPartialReusePages
            (&(this->smallNormalWithBarrierHeapBucket).
              super_SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             ,recyclerSweep);
  SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  ::SweepPartialReusePages
            ((SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
              *)&this->smallFinalizableWithBarrierHeapBucket,recyclerSweep);
  SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
  SweepPartialReusePages
            ((SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
              *)&this->finalizableHeapBucket,recyclerSweep);
  return;
}

Assistant:

void
HeapBucketGroup<TBlockAttributes>::SweepPartialReusePages(RecyclerSweep& recyclerSweep)
{
    // Leaf heap bucket are always reused for allocation and can be done on the concurrent thread
    // WriteBarrier-TODO: Do the same for write barrier buckets
    heapBucket.SweepPartialReusePages(recyclerSweep);

#ifdef RECYCLER_WRITE_BARRIER
    smallNormalWithBarrierHeapBucket.SweepPartialReusePages(recyclerSweep);
    smallFinalizableWithBarrierHeapBucket.SweepPartialReusePages(recyclerSweep);
#endif

    finalizableHeapBucket.SweepPartialReusePages(recyclerSweep);
#ifdef RECYCLER_VISITED_HOST
    recyclerVisitedHostHeapBucket.SweepPartialReusePages(recyclerSweep);
#endif
}